

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

void __thiscall cfd::core::Block::Block(Block *this,ByteData *data)

{
  initializer_list<unsigned_int> __l;
  uint32_t uVar1;
  pointer pTVar2;
  size_t sVar3;
  reference pvVar4;
  Txid local_208;
  allocator<unsigned_int> local_1e1;
  uint local_1e0;
  int local_1dc;
  iterator local_1d8;
  size_type local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> arr;
  uint32_t unread_size;
  uint32_t cur_size;
  ByteData tx_data;
  Transaction tx;
  uint64_t index;
  undefined1 local_118 [8];
  ByteData txs;
  size_t read_size;
  uint64_t tx_count;
  ByteData256 local_d8;
  BlockHash local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  ByteData256 local_88;
  BlockHash local_70;
  undefined1 local_50 [8];
  Deserializer dec;
  ByteData *data_local;
  Block *this_local;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_0088f650;
  ByteData::ByteData(&this->data_,data);
  BlockHeader::BlockHeader(&this->header_);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&this->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&this->txids_);
  Deserializer::Deserializer((Deserializer *)local_50,data);
  uVar1 = Deserializer::ReadUint32((Deserializer *)local_50);
  (this->header_).version = uVar1;
  Deserializer::ReadBuffer(&local_a0,(Deserializer *)local_50,0x20);
  ByteData256::ByteData256(&local_88,&local_a0);
  BlockHash::BlockHash(&local_70,&local_88);
  BlockHash::operator=(&(this->header_).prev_block_hash,&local_70);
  BlockHash::~BlockHash(&local_70);
  ByteData256::~ByteData256(&local_88);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  Deserializer::ReadBuffer
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_count,
             (Deserializer *)local_50,0x20);
  ByteData256::ByteData256
            (&local_d8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_count);
  BlockHash::BlockHash(&local_c0,&local_d8);
  BlockHash::operator=(&(this->header_).merkle_root_hash,&local_c0);
  BlockHash::~BlockHash(&local_c0);
  ByteData256::~ByteData256(&local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_count);
  uVar1 = Deserializer::ReadUint32((Deserializer *)local_50);
  (this->header_).time = uVar1;
  uVar1 = Deserializer::ReadUint32((Deserializer *)local_50);
  (this->header_).bits = uVar1;
  uVar1 = Deserializer::ReadUint32((Deserializer *)local_50);
  (this->header_).nonce = uVar1;
  pTVar2 = (pointer)Deserializer::ReadVariableInt((Deserializer *)local_50);
  sVar3 = ByteData::GetDataSize(data);
  uVar1 = Deserializer::GetReadSize((Deserializer *)local_50);
  txs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 - uVar1);
  Deserializer::ReadBuffer
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index,
             (Deserializer *)local_50,
             (uint32_t)
             txs.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  ByteData::ByteData((ByteData *)local_118,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
  for (tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < pTVar2;
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((tx.vout_.
                              super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_AbstractTxOut)._vptr_AbstractTxOut + 1)) {
    Transaction::Transaction
              ((Transaction *)
               &tx_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_118);
    AbstractTransaction::GetData
              ((ByteData *)&unread_size,
               (AbstractTransaction *)
               &tx_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar3 = ByteData::GetDataSize((ByteData *)&unread_size);
    arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar3;
    sVar3 = ByteData::GetDataSize((ByteData *)local_118);
    arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)sVar3 -
         arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    if ((int)arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      local_1e0 = arr.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_1d8 = &local_1e0;
      local_1d0 = 2;
      local_1dc = (int)arr.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ::std::allocator<unsigned_int>::allocator(&local_1e1);
      __l._M_len = local_1d0;
      __l._M_array = local_1d8;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c8,__l,&local_1e1);
      ByteData::SplitData((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          local_1b0,(ByteData *)local_118,&local_1c8);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c8);
      ::std::allocator<unsigned_int>::~allocator(&local_1e1);
      pvVar4 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          local_1b0,1);
      ByteData::operator=((ByteData *)local_118,pvVar4);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_1b0);
    }
    ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
    emplace_back<cfd::core::ByteData&>
              ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)&this->txs_,
               (ByteData *)&unread_size);
    AbstractTransaction::GetTxid
              (&local_208,
               (AbstractTransaction *)
               &tx_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::emplace_back<cfd::core::Txid>
              (&this->txids_,&local_208);
    Txid::~Txid(&local_208);
    ByteData::~ByteData((ByteData *)&unread_size);
    Transaction::~Transaction
              ((Transaction *)
               &tx_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ByteData::~ByteData((ByteData *)local_118);
  Deserializer::~Deserializer((Deserializer *)local_50);
  return;
}

Assistant:

Block::Block(const ByteData& data) : data_(data) {
  Deserializer dec(data);
  header_.version = dec.ReadUint32();
  header_.prev_block_hash = BlockHash(dec.ReadBuffer(32));
  header_.merkle_root_hash = BlockHash(dec.ReadBuffer(32));
  header_.time = dec.ReadUint32();
  header_.bits = dec.ReadUint32();
  header_.nonce = dec.ReadUint32();
  uint64_t tx_count = dec.ReadVariableInt();
  size_t read_size = data.GetDataSize() - dec.GetReadSize();
  auto txs = ByteData(dec.ReadBuffer(static_cast<uint32_t>(read_size)));
  for (uint64_t index = 0; index < tx_count; ++index) {
    Transaction tx(txs);
    auto tx_data = tx.GetData();
    uint32_t cur_size = static_cast<uint32_t>(tx_data.GetDataSize());
    uint32_t unread_size = static_cast<uint32_t>(txs.GetDataSize()) - cur_size;
    if (unread_size != 0) {
      auto arr = txs.SplitData(std::vector<uint32_t>{cur_size, unread_size});
      txs = arr[1];
    }
    txs_.emplace_back(tx_data);
    txids_.emplace_back(tx.GetTxid());
  }
}